

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O1

size_t __thiscall CScheduler::getQueueInfo(CScheduler *this,time_point *first,time_point *last)

{
  size_t sVar1;
  long lVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->newTaskMutex).super_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  sVar1 = (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    (first->__d).__r =
         *(rep *)((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    lVar2 = std::_Rb_tree_decrement(&(this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header)
    ;
    (last->__d).__r = *(rep *)(lVar2 + 0x20);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t CScheduler::getQueueInfo(std::chrono::steady_clock::time_point& first,
                                std::chrono::steady_clock::time_point& last) const
{
    LOCK(newTaskMutex);
    size_t result = taskQueue.size();
    if (!taskQueue.empty()) {
        first = taskQueue.begin()->first;
        last = taskQueue.rbegin()->first;
    }
    return result;
}